

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-to-source.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ulong uVar2;
  reference puVar3;
  pointer ppVar4;
  size_type sVar5;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *in_RSI;
  int in_EDI;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar6;
  ifstream ifs;
  value_type *pr;
  iterator it;
  uint i;
  iterator __end3;
  iterator __begin3;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range3;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> new_lines;
  size_t old_size;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> lines;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  SMDiagnostic SMD;
  LLVMContext context;
  undefined8 in_stack_fffffffffffffb38;
  uint uVar7;
  string *Str;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *this;
  SMDiagnostic *in_stack_fffffffffffffb40;
  SMDiagnostic *this_00;
  string *in_stack_fffffffffffffb48;
  StringRef *in_stack_fffffffffffffb50;
  raw_ostream *prVar8;
  undefined4 in_stack_fffffffffffffb58;
  undefined1 local_498 [80];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_fffffffffffffbb8;
  Module *in_stack_fffffffffffffbc0;
  _Self local_268;
  _Self local_260;
  _Base_ptr local_258;
  undefined1 local_250;
  uint local_244;
  _Self in_stack_fffffffffffffdc0;
  _Self local_238;
  undefined1 *local_230;
  size_type local_1f8;
  undefined1 local_1f0 [48];
  int local_1c0;
  anon_class_1_0_00000001 local_1b9;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_1b8;
  SMDiagnostic *local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [8];
  char local_190 [216];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffff48;
  ifstream *in_stack_ffffffffffffff50;
  LLVMContext local_28 [8];
  StringRef local_20;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_10;
  int local_4;
  
  uVar7 = (uint)((ulong)in_stack_fffffffffffffb38 >> 0x20);
  local_4 = 0;
  local_10 = in_RSI;
  llvm::StringRef::StringRef(in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
  Str = (string *)((ulong)uVar7 << 0x20);
  llvm::cl::ParseCommandLineOptions
            (in_EDI,(char **)in_RSI,local_20,(raw_ostream *)0x0,(char *)0x0,false);
  llvm::LLVMContext::LLVMContext(local_28);
  llvm::SMDiagnostic::SMDiagnostic(in_stack_fffffffffffffb40);
  llvm::StringRef::StringRef((StringRef *)in_stack_fffffffffffffb40,Str);
  llvm::function_ref<llvm::Optional<std::__cxx11::string>(llvm::StringRef)>::function_ref<llvm::__0>
            ((function_ref<llvm::Optional<std::__cxx11::string>(llvm::StringRef)> *)&local_1b8,
             &local_1b9,
             (enable_if_t<_std::is_same<remove_cvref_t<(lambda_at__usr_lib_llvm_14_include_llvm_IRReader_IRReader_h:65:47)>,_function_ref<Optional<basic_string<char>_>_(StringRef)>_>::value>
              *)0x0,(enable_if_t<std::is_void<Optional<basic_string<char>_>_>::value____std::is_convertible<decltype(std::declval<(lambda_at__usr_lib_llvm_14_include_llvm_IRReader_IRReader_h:65:47)>()(std::declval<StringRef>())),_Optional<basic_string<char>_>_>::value>
                     *)0x0);
  llvm::parseIRFile(local_198,local_1a8,local_1a0,local_190,local_28);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x10e76f);
  if (!bVar1) {
    llvm::errs();
    llvm::raw_ostream::operator<<
              ((raw_ostream *)in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
    llvm::raw_ostream::operator<<
              ((raw_ostream *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    llvm::raw_ostream::operator<<
              ((raw_ostream *)in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
    prVar8 = *(raw_ostream **)&(local_10->_M_t)._M_impl;
    bVar1 = (bool)llvm::errs();
    llvm::SMDiagnostic::print(local_190,prVar8,bVar1,true);
    local_4 = 1;
    local_1c0 = 1;
    this_00 = local_1b0;
    goto LAB_0010eb22;
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x10e80b);
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::operator*
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)local_1b0);
  get_lines_from_module(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    get_nesting_structure((string *)in_stack_fffffffffffffdc0._M_node);
    this = local_1b8;
    this_00 = local_1b0;
    do {
      local_1f8 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  size((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       0x10e873);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 0x10e888);
      local_230 = local_1f0;
      local_238._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                     (this);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end(this);
      while (bVar1 = std::operator!=(&local_238,(_Self *)&stack0xfffffffffffffdc0), bVar1) {
        puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                           ((_Rb_tree_const_iterator<unsigned_int> *)0x10e8ed);
        local_244 = *puVar3;
        pVar6 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                insert(in_RSI,(value_type_conflict *)CONCAT44(in_EDI,in_stack_fffffffffffffb58));
        local_258 = (_Base_ptr)pVar6.first._M_node;
        local_250 = pVar6.second;
        local_260._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::find((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     *)this,(key_type *)0x10e92e);
        local_268._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::end((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)this);
        bVar1 = std::operator!=(&local_260,&local_268);
        if (bVar1) {
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_> *)
                              0x10e972);
          std::
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ::operator[](&matching_braces,(ulong)ppVar4->second);
          std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                    (in_RSI,(value_type_conflict *)CONCAT44(in_EDI,in_stack_fffffffffffffb58));
          std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                    (in_RSI,(value_type_conflict *)CONCAT44(in_EDI,in_stack_fffffffffffffb58));
        }
        std::_Rb_tree_const_iterator<unsigned_int>::operator++
                  ((_Rb_tree_const_iterator<unsigned_int> *)this_00);
      }
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::swap
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 this_00,this);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 0x10ea0d);
      sVar5 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)0x10ea1a);
    } while (local_1f8 < sVar5);
    std::ifstream::ifstream(local_498,0x11b360,8);
    uVar2 = std::ifstream::is_open();
    if (((uVar2 & 1) == 0) || (uVar2 = std::ios::bad(), (uVar2 & 1) != 0)) {
      llvm::errs();
      llvm::raw_ostream::operator<<
                ((raw_ostream *)in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
      llvm::raw_ostream::operator<<
                ((raw_ostream *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      llvm::raw_ostream::operator<<
                ((raw_ostream *)in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48);
      local_4 = 1;
      local_1c0 = 1;
    }
    else {
      print_lines(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::ifstream::close();
      local_1c0 = 0;
    }
    std::ifstream::~ifstream(local_498);
    if (local_1c0 == 0) goto LAB_0010eaff;
  }
  else {
    print_lines_numbers((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )in_stack_fffffffffffffb50);
    this_00 = local_1b0;
LAB_0010eaff:
    local_4 = 0;
    local_1c0 = 1;
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x10eb22);
LAB_0010eb22:
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)this_00);
  llvm::SMDiagnostic::~SMDiagnostic(this_00);
  llvm::LLVMContext::~LLVMContext(local_28);
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
    llvm::cl::ParseCommandLineOptions(argc, argv);

    llvm::LLVMContext context;
    llvm::SMDiagnostic SMD;

    std::unique_ptr<llvm::Module> M =
            llvm::parseIRFile(inputFile, SMD, context);
    if (!M) {
        llvm::errs() << "Failed parsing '" << inputFile << "' file:\n";
        SMD.print(argv[0], llvm::errs());
        return 1;
    }

    // FIXME find out if we have debugging info at all
    // no difficult machineris - just find out
    // which lines are in our module and print them
    std::set<unsigned> lines;
    get_lines_from_module(*M, lines);

    if (sourceFile.empty())
        print_lines_numbers(lines);
    else {
        get_nesting_structure(sourceFile);
        /* fill in the lines with braces */
        /* really not efficient, but easy */
        size_t old_size;
        do {
            old_size = lines.size();
            std::set<unsigned> new_lines;

            for (unsigned i : lines) {
                new_lines.insert(i);
                auto it = nesting_structure.find(i);
                if (it != nesting_structure.end()) {
                    auto &pr = matching_braces[it->second];
                    new_lines.insert(pr.first);
                    new_lines.insert(pr.second);
                }
            }

            lines.swap(new_lines);
        } while (lines.size() > old_size);

        std::ifstream ifs(sourceFile);
        if (!ifs.is_open() || ifs.bad()) {
            llvm::errs() << "Failed opening given source file: " << sourceFile
                         << "\n";
            return 1;
        }

        // print_lines_numbers(lines);
        print_lines(ifs, lines);
        ifs.close();
    }

    return 0;
}